

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  pointer ppVar6;
  LogMessage *pLVar7;
  Descriptor *pDVar8;
  undefined8 uVar9;
  ExtensionSet *pEVar10;
  int local_dc;
  ExtensionSet *local_d8;
  MessageLite *ret;
  LogMessage local_c8;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  _Self local_40;
  int local_34;
  _Self local_30;
  iterator iter;
  MessageFactory *factory_local;
  FieldDescriptor *descriptor_local;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)factory;
  local_34 = FieldDescriptor::number(descriptor);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,&local_34);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  bVar3 = std::operator==(&local_30,&local_40);
  if (bVar3) {
    this_local = (ExtensionSet *)0x0;
  }
  else {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_30);
    iVar4 = 1;
    if (((ppVar6->second).is_repeated & 1U) != 0) {
      iVar4 = 3;
    }
    local_79 = 0;
    if (iVar4 != 1) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xc4);
      local_79 = 1;
      pLVar7 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: ((iter->second).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=(local_8d,pLVar7);
    }
    if ((local_79 & 1) != 0) {
      LogMessage::~LogMessage(&local_78);
    }
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_30);
    CVar5 = cpp_type((ppVar6->second).type);
    ret._7_1_ = 0;
    if (CVar5 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xc4);
      ret._7_1_ = 1;
      pLVar7 = LogMessage::operator<<
                         (&local_c8,
                          "CHECK failed: (cpp_type((iter->second).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)((long)&ret + 6),pLVar7);
    }
    if ((ret._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_c8);
    }
    local_d8 = (ExtensionSet *)0x0;
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_30);
    if (((byte)(ppVar6->second).field_0xa >> 4 & 1) == 0) {
      if (this->arena_ == (Arena *)0x0) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 ::operator->(&local_30);
        local_d8 = (ExtensionSet *)(ppVar6->second).field_0.string_value;
      }
      else {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 ::operator->(&local_30);
        pEVar10 = (ExtensionSet *)
                  (**(code **)((((ppVar6->second).field_0.repeated_string_value)->
                               super_RepeatedPtrFieldBase).arena_ + 0x18))();
        local_d8 = pEVar10;
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 ::operator->(&local_30);
        (**(code **)(*(long *)&(pEVar10->extensions_)._M_t._M_impl + 0x50))
                  (pEVar10,(ppVar6->second).field_0.int64_value);
      }
    }
    else {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_30);
      iVar2 = iter;
      pRVar1 = (ppVar6->second).field_0.repeated_string_value;
      pDVar8 = FieldDescriptor::message_type(descriptor);
      uVar9 = (**(code **)(*(long *)iVar2._M_node + 0x10))(iVar2._M_node,pDVar8);
      local_d8 = (ExtensionSet *)
                 (**(code **)((pRVar1->super_RepeatedPtrFieldBase).arena_ + 0x38))(pRVar1,uVar9);
      if (this->arena_ == (Arena *)0x0) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 ::operator->(&local_30);
        pRVar1 = (ppVar6->second).field_0.repeated_string_value;
        if (pRVar1 != (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0) {
          (**(code **)((pRVar1->super_RepeatedPtrFieldBase).arena_ + 8))();
        }
      }
    }
    local_dc = FieldDescriptor::number(descriptor);
    std::
    map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::erase(&this->extensions_,&local_dc);
    this_local = local_d8;
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  ExtensionMap::iterator iter = extensions_.find(descriptor->number());
  if (iter == extensions_.end()) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (iter->second.is_lazy) {
      ret = iter->second.lazymessage_value->ReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()));
      if (arena_ == NULL) {
        delete iter->second.lazymessage_value;
      }
    } else {
      if (arena_ != NULL) {
        ret = (iter->second.message_value)->New();
        ret->CheckTypeAndMergeFrom(*(iter->second.message_value));
      } else {
        ret = iter->second.message_value;
      }
    }
    extensions_.erase(descriptor->number());
    return ret;
  }
}